

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall
wasm::anon_unknown_0::TypePrinter::print
          (TypePrinter *this,Array *array,optional<wasm::HeapType> super)

{
  ostream *poVar1;
  
  std::operator<<(this->os,"(array");
  if (((undefined1  [16])
       super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::operator<<(this->os,' ');
    print(this,&array->element);
  }
  else {
    std::operator<<(this->os,"_subtype");
    std::operator<<(this->os,' ');
    print(this,&array->element);
    std::operator<<(this->os,' ');
    printHeapTypeName(this,super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
  }
  poVar1 = std::operator<<(this->os,')');
  return poVar1;
}

Assistant:

std::ostream& TypePrinter::print(const Array& array,
                                 std::optional<HeapType> super) {
  os << "(array";
  if (super) {
    os << "_subtype";
  }
  os << ' ';
  print(array.element);
  if (super) {
    os << ' ';
    printHeapTypeName(*super);
  }
  return os << ')';
}